

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O1

pair<unsigned_int,_Elf64_Sym> * __thiscall
pstack::Elf::SymHash::findSymbol
          (pair<unsigned_int,_Elf64_Sym> *__return_storage_ptr__,SymHash *this,string *name)

{
  element_type *peVar1;
  Elf64_Addr EVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  size_type sVar6;
  uint uVar7;
  Word WVar8;
  string *__range2;
  bool bVar9;
  undefined1 auStack_80 [8];
  value_type candidate;
  undefined1 *local_60;
  string candidateName;
  uint local_34;
  
  if (name->_M_string_length == 0) {
    uVar4 = 0;
  }
  else {
    sVar6 = 0;
    uVar4 = 0;
    do {
      uVar7 = uVar4 * 0x10 + (int)(name->_M_dataplus)._M_p[sVar6];
      uVar4 = uVar7 & 0xf0000000;
      uVar4 = ~uVar4 & (uVar4 >> 0x18 ^ uVar7);
      sVar6 = sVar6 + 1;
    } while (name->_M_string_length != sVar6);
  }
  local_34 = __return_storage_ptr__->first;
  WVar8 = this->buckets[(ulong)uVar4 % (ulong)this->nbucket];
  candidateName.field_2._8_8_ = __return_storage_ptr__;
  if (WVar8 != 0) {
    candidate.st_size = (Elf64_Xword)&__return_storage_ptr__->second;
    do {
      Reader::readObj<Elf64_Sym>
                ((this->syms).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(ulong)WVar8 * 0x18,(value_type *)auStack_80,1);
      peVar1 = (this->strings).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*peVar1->_vptr_Reader[7])(&local_60,peVar1,(ulong)(uint)auStack_80._0_4_);
      if (candidateName._M_dataplus._M_p == (pointer)name->_M_string_length) {
        if (candidateName._M_dataplus._M_p == (pointer)0x0) {
          bVar9 = true;
        }
        else {
          iVar5 = bcmp(local_60,(name->_M_dataplus)._M_p,(size_t)candidateName._M_dataplus._M_p);
          bVar9 = iVar5 == 0;
        }
      }
      else {
        bVar9 = false;
      }
      if (bVar9) {
        *(Elf64_Addr *)(candidate.st_size + 0x10) = candidate.st_value;
        *(ulong *)candidate.st_size = CONCAT44(auStack_80._4_4_,auStack_80._0_4_);
        *(undefined8 *)(candidate.st_size + 8) = candidate._0_8_;
        if ((size_type *)local_60 != &candidateName._M_string_length) {
          operator_delete(local_60,candidateName._M_string_length + 1);
        }
        local_34 = WVar8;
        if (bVar9) {
          *(Word *)candidateName.field_2._8_8_ = WVar8;
          return (pair<unsigned_int,_Elf64_Sym> *)candidateName.field_2._8_8_;
        }
      }
      else if ((size_type *)local_60 != &candidateName._M_string_length) {
        operator_delete(local_60,candidateName._M_string_length + 1);
      }
      WVar8 = this->chains[WVar8];
    } while (WVar8 != 0);
  }
  uVar3 = candidateName.field_2._8_8_;
  *(uint *)candidateName.field_2._8_8_ = local_34;
  undef();
  *(undefined4 *)uVar3 = 0;
  EVar2 = undef::theUndef.undefSym.st_value;
  *(undefined8 *)(uVar3 + 8) = undef::theUndef.undefSym._0_8_;
  *(Elf64_Addr *)(uVar3 + 0x10) = EVar2;
  *(Elf64_Xword *)(uVar3 + 0x18) = undef::theUndef.undefSym.st_size;
  return (pair<unsigned_int,_Elf64_Sym> *)uVar3;
}

Assistant:

std::pair<uint32_t, Sym>
SymHash::findSymbol(const string &name)
{
    uint32_t bucket = elf_hash(name) % nbucket;
    for (Word i = buckets[bucket]; i != STN_UNDEF; i = chains[i]) {
        auto candidate = syms->readObj<Sym>(i * sizeof (Sym));
        auto candidateName = strings->readString(candidate.st_name);
        if (candidateName == name)
            return std::make_pair(i, candidate);
    }
    return std::make_pair(0, undef());
}